

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O1

bool __thiscall ON_Surface::IsTorus(ON_Surface *this,ON_Torus *torus,double tolerance)

{
  double dVar1;
  ON_3dPoint P_00;
  ON_3dPoint P_01;
  ON_3dPoint test_point;
  ON_3dPoint test_point_00;
  ON_3dPoint test_point_01;
  ON_3dPoint test_point_02;
  ON_3dPoint test_point_03;
  ON_3dPoint test_point_04;
  ON_Surface *pOVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *memblock;
  int iVar11;
  long lVar12;
  int iVar13;
  ON_Plane *pOVar14;
  ON_Circle *pOVar15;
  ON_Torus *pOVar16;
  ulong uVar17;
  bool bVar18;
  byte bVar19;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double extraout_XMM1_Qa;
  double dVar20;
  double dVar21;
  ulong uVar22;
  ON_3dPoint P;
  ON_3dPoint T;
  ON_Torus tr1;
  ON_Torus tr0;
  ON_Arc arc1;
  ON_Arc arc0;
  uint local_368;
  ON_3dVector local_358;
  double local_338;
  double local_330;
  ON_3dPoint local_328;
  uint local_30c;
  ON_3dVector local_308;
  undefined1 local_2e8 [16];
  void *local_2d8;
  double local_2d0;
  double local_2c8;
  ulong local_2c0;
  ON_Surface *local_2b8;
  ulong local_2b0;
  ON_Torus *local_2a8;
  ulong local_2a0;
  ulong local_298;
  ulong local_290;
  ON_Torus local_288;
  ON_Torus local_1f8;
  ON_Circle local_160;
  double local_d8;
  double dStack_d0;
  ON_Circle local_c8;
  double local_40;
  double dStack_38;
  long *plVar10;
  
  bVar19 = 0;
  local_2e8._8_4_ = in_XMM0_Dc;
  local_2e8._0_8_ = tolerance;
  local_2e8._12_4_ = in_XMM0_Dd;
  bVar3 = ON_IsValid(tolerance);
  dVar20 = (double)local_2e8._0_8_;
  uVar17 = local_2e8._8_8_;
  if (!bVar3) {
    dVar20 = 2.3283064365386963e-10;
    uVar17 = 0;
  }
  dVar21 = dVar20;
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,1);
  local_c8.plane.origin.x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  local_c8.plane.origin.y = dVar21;
  dVar21 = ON_Interval::Mid((ON_Interval *)&local_c8);
  iVar7 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])(SUB84(dVar21,0),this,0)
  ;
  plVar10 = (long *)CONCAT44(extraout_var,iVar7);
  if (plVar10 == (long *)0x0) {
    return false;
  }
  uVar22 = (ulong)dVar20 & -(ulong)(0.0 < (double)local_2e8._0_8_);
  local_2e8._0_8_ = ~-(ulong)(0.0 < (double)local_2e8._0_8_) & 0x3df0000000000000 | uVar22;
  pOVar14 = &ON_Plane::World_xy;
  pOVar15 = &local_c8;
  for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pOVar15->plane).origin.x = (pOVar14->origin).x;
    pOVar14 = (ON_Plane *)((long)pOVar14 + ((ulong)bVar19 * -2 + 1) * 8);
    pOVar15 = (ON_Circle *)((long)pOVar15 + ((ulong)bVar19 * -2 + 1) * 8);
  }
  local_c8.radius = 1.0;
  local_40 = ON_Interval::ZeroToTwoPi.m_t[0];
  dStack_38 = ON_Interval::ZeroToTwoPi.m_t[1];
  local_2e8._8_8_ = uVar17 & local_2e8._8_8_;
  local_368 = -(uint)(2.3283064365386963e-10 < (double)local_2e8._0_8_) & (uint)uVar22;
  local_2a8 = torus;
  cVar4 = (**(code **)(*plVar10 + 0x180))(plVar10,0);
  (**(code **)(*plVar10 + 0x20))(plVar10);
  if (cVar4 != '\0') {
    dVar20 = extraout_XMM1_Qa;
    (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,0);
    local_160.plane.origin.x = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
    local_160.plane.origin.y = dVar20;
    dVar20 = ON_Interval::Mid((ON_Interval *)&local_160);
    iVar7 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])
                      (SUB84(dVar20,0),this,1);
    plVar10 = (long *)CONCAT44(extraout_var_00,iVar7);
    if (plVar10 != (long *)0x0) {
      pOVar14 = &ON_Plane::World_xy;
      pOVar15 = &local_160;
      for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pOVar15->plane).origin.x = (pOVar14->origin).x;
        pOVar14 = (ON_Plane *)((long)pOVar14 + ((ulong)bVar19 * -2 + 1) * 8);
        pOVar15 = (ON_Circle *)((long)pOVar15 + ((ulong)bVar19 * -2 + 1) * 8);
      }
      local_160.radius = 1.0;
      local_d8 = ON_Interval::ZeroToTwoPi.m_t[0];
      dStack_d0 = ON_Interval::ZeroToTwoPi.m_t[1];
      cVar4 = (**(code **)(*plVar10 + 0x180))(local_368,plVar10,0);
      (**(code **)(*plVar10 + 0x20))(plVar10);
      if (cVar4 == '\0') {
        bVar3 = false;
      }
      else {
        dVar20 = local_c8.radius + local_160.radius;
        ON_Torus::ON_Torus(&local_1f8);
        pOVar15 = &local_c8;
        pOVar16 = &local_1f8;
        for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pOVar16->plane).origin.x = (pOVar15->plane).origin.x;
          pOVar15 = (ON_Circle *)((long)pOVar15 + ((ulong)bVar19 * -2 + 1) * 8);
          pOVar16 = (ON_Torus *)((long)pOVar16 + ((ulong)bVar19 * -2 + 1) * 8);
        }
        P_00.y = local_160.plane.origin.y;
        P_00.x = local_160.plane.origin.x;
        P_00.z = local_160.plane.origin.z;
        dVar21 = ON_PlaneEquation::ValueAt(&local_1f8.plane.plane_equation,P_00);
        ::operator*(&local_358,dVar21,&local_1f8.plane.zaxis);
        ON_3dPoint::operator+((ON_3dPoint *)&local_288,(ON_3dPoint *)&local_1f8,&local_358);
        local_1f8.plane.origin.z = local_288.plane.origin.z;
        local_1f8.plane.origin.x = local_288.plane.origin.x;
        local_1f8.plane.origin.y = local_288.plane.origin.y;
        ON_Plane::UpdateEquation(&local_1f8.plane);
        local_1f8.major_radius =
             ON_3dPoint::DistanceTo((ON_3dPoint *)&local_1f8,(ON_3dPoint *)&local_160);
        local_1f8.minor_radius = local_160.radius;
        ON_Torus::ON_Torus(&local_288);
        pOVar15 = &local_160;
        pOVar16 = &local_288;
        for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pOVar16->plane).origin.x = (pOVar15->plane).origin.x;
          pOVar15 = (ON_Circle *)((long)pOVar15 + ((ulong)bVar19 * -2 + 1) * 8);
          pOVar16 = (ON_Torus *)((long)pOVar16 + ((ulong)bVar19 * -2 + 1) * 8);
        }
        P_01.y = local_c8.plane.origin.y;
        P_01.x = local_c8.plane.origin.x;
        P_01.z = local_c8.plane.origin.z;
        dVar21 = ON_PlaneEquation::ValueAt(&local_288.plane.plane_equation,P_01);
        ::operator*(&local_308,dVar21,&local_288.plane.zaxis);
        ON_3dPoint::operator+((ON_3dPoint *)&local_358,(ON_3dPoint *)&local_288,&local_308);
        local_288.plane.origin.z = local_358.z;
        local_288.plane.origin.x = local_358.x;
        local_288.plane.origin.y = local_358.y;
        ON_Plane::UpdateEquation(&local_288.plane);
        local_288.major_radius =
             ON_3dPoint::DistanceTo((ON_3dPoint *)&local_288,(ON_3dPoint *)&local_c8);
        local_288.minor_radius = local_c8.radius;
        bVar5 = ON_Torus::IsValid(&local_1f8,(ON_TextLog *)0x0);
        bVar6 = ON_Torus::IsValid(&local_288,(ON_TextLog *)0x0);
        if (bVar5 || bVar6) {
          dVar20 = dVar20 * 7.450580596925e-09;
          dVar21 = 0.0;
          local_338 = 0.0;
          local_330 = 0.0;
          local_2b8 = this;
          do {
            local_2c8 = (dVar21 + dVar21) * 3.141592653589793;
            local_2d0 = dVar21;
            ON_Circle::PointAt(&local_328,&local_c8,local_2c8);
            local_358.z = local_328.z;
            local_358.x = local_328.x;
            local_358.y = local_328.y;
            if (bVar5 != false) {
              test_point.y = local_328.y;
              test_point.x = local_328.x;
              test_point.z = local_328.z;
              ON_Torus::ClosestPointTo(&local_328,&local_1f8,test_point);
              local_308.z = local_328.z;
              local_308.x = local_328.x;
              local_308.y = local_328.y;
              dVar21 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_308,(ON_3dPoint *)&local_358);
              if (dVar21 <= dVar20) {
                if (local_330 < dVar21) {
                  local_330 = dVar21;
                }
              }
              else {
                bVar5 = false;
                bVar3 = false;
                if (bVar6 == false) goto LAB_005add2f;
              }
            }
            if (bVar6 != false) {
              test_point_00.y = local_358.y;
              test_point_00.x = local_358.x;
              test_point_00.z = local_358.z;
              ON_Torus::ClosestPointTo(&local_328,&local_288,test_point_00);
              local_308.z = local_328.z;
              local_308.x = local_328.x;
              local_308.y = local_328.y;
              dVar21 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_308,(ON_3dPoint *)&local_358);
              if (dVar21 <= dVar20) {
                if (local_338 < dVar21) {
                  local_338 = dVar21;
                }
              }
              else {
                bVar6 = false;
                bVar3 = false;
                if (bVar5 == false) goto LAB_005add2f;
              }
            }
            ON_Circle::PointAt(&local_328,&local_160,local_2c8);
            local_358.z = local_328.z;
            local_358.x = local_328.x;
            local_358.y = local_328.y;
            if (bVar5 != false) {
              test_point_01.y = local_328.y;
              test_point_01.x = local_328.x;
              test_point_01.z = local_328.z;
              ON_Torus::ClosestPointTo(&local_328,&local_1f8,test_point_01);
              local_308.z = local_328.z;
              local_308.x = local_328.x;
              local_308.y = local_328.y;
              dVar21 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_308,(ON_3dPoint *)&local_358);
              if (dVar21 <= dVar20) {
                if (local_330 < dVar21) {
                  local_330 = dVar21;
                }
              }
              else {
                bVar5 = false;
                bVar3 = false;
                if (bVar6 == false) goto LAB_005add2f;
              }
            }
            if (bVar6 != false) {
              test_point_02.y = local_358.y;
              test_point_02.x = local_358.x;
              test_point_02.z = local_358.z;
              ON_Torus::ClosestPointTo(&local_328,&local_288,test_point_02);
              local_308.z = local_328.z;
              local_308.x = local_328.x;
              local_308.y = local_328.y;
              dVar21 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_308,(ON_3dPoint *)&local_358);
              if (dVar21 <= dVar20) {
                if (local_338 < dVar21) {
                  local_338 = dVar21;
                }
              }
              else {
                bVar6 = false;
                bVar3 = false;
                if (bVar5 == false) goto LAB_005add2f;
              }
            }
            pOVar2 = local_2b8;
            dVar21 = local_2d0 + 0.25;
          } while (dVar21 < 1.0);
          if ((bVar5 == false) && (bVar6 == false)) goto LAB_005add2c;
          uVar8 = (*(local_2b8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])
                            (local_2b8,0);
          uVar9 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(pOVar2,1);
          memblock = onmalloc((long)(int)(uVar8 + uVar9 + 2) << 3);
          local_2c0 = (ulong)uVar9;
          (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(pOVar2,0,memblock);
          lVar12 = (long)(int)uVar8 * 8 + 8 + (long)memblock;
          (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(pOVar2,1,lVar12);
          bVar3 = 0 < (int)uVar8;
          if (0 < (int)uVar8) {
            dVar21 = local_2e8._0_8_;
            if (local_2e8._0_8_ <= dVar20) {
              dVar21 = dVar20;
            }
            local_2e8._8_4_ = local_2e8._8_4_;
            local_2e8._0_8_ = dVar21;
            iVar7 = (int)local_2c0;
            local_2d0 = (double)(long)iVar7;
            local_2b0 = (ulong)uVar8;
            local_290 = local_2c0 & 0xffffffff;
            uVar17 = 0;
            local_2d8 = memblock;
            do {
              uVar22 = (ulong)(uVar17 != 0);
              local_30c = 0;
              local_2a0 = uVar17;
              do {
                iVar11 = (int)uVar22;
                dVar20 = *(double *)((long)local_2d8 + local_2a0 * 8 + 8);
                dVar21 = *(double *)((long)local_2d8 + local_2a0 * 8);
                bVar19 = 0 < iVar7;
                local_298 = uVar22;
                if (0 < (int)local_2c0) {
                  uVar17 = 0;
                  do {
                    local_2c8 = (double)CONCAT71(local_2c8._1_7_,bVar19);
                    uVar8 = (uint)(uVar17 != 0);
                    iVar13 = 4 - (uint)(uVar17 != 0);
                    bVar18 = false;
                    do {
                      PointAt(&local_328,local_2b8,
                              ((double)(4 - iVar11) * dVar21 + (double)iVar11 * dVar20) * 0.25,
                              ((double)iVar13 * *(double *)(lVar12 + uVar17 * 8) +
                              (double)(int)uVar8 * *(double *)(lVar12 + 8 + uVar17 * 8)) * 0.25);
                      local_358.z = local_328.z;
                      local_358.x = local_328.x;
                      local_358.y = local_328.y;
                      if (bVar5 != false) {
                        test_point_03.y = local_328.y;
                        test_point_03.x = local_328.x;
                        test_point_03.z = local_328.z;
                        ON_Torus::ClosestPointTo(&local_328,&local_1f8,test_point_03);
                        local_308.z = local_328.z;
                        local_308.x = local_328.x;
                        local_308.y = local_328.y;
                        dVar1 = ON_3dPoint::DistanceTo
                                          ((ON_3dPoint *)&local_308,(ON_3dPoint *)&local_358);
                        if (dVar1 <= (double)local_2e8._0_8_) {
                          if (local_330 < dVar1) {
                            local_330 = dVar1;
                          }
                        }
                        else {
                          if (bVar6 == false) {
                            onfree(local_2d8);
                            bVar5 = false;
                            break;
                          }
                          bVar5 = false;
                        }
                      }
                      if (bVar6 != false) {
                        test_point_04.y = local_358.y;
                        test_point_04.x = local_358.x;
                        test_point_04.z = local_358.z;
                        ON_Torus::ClosestPointTo(&local_328,&local_288,test_point_04);
                        local_308.z = local_328.z;
                        local_308.x = local_328.x;
                        local_308.y = local_328.y;
                        dVar1 = ON_3dPoint::DistanceTo
                                          ((ON_3dPoint *)&local_308,(ON_3dPoint *)&local_358);
                        if (dVar1 <= (double)local_2e8._0_8_) {
                          if (local_338 < dVar1) {
                            local_338 = dVar1;
                          }
                        }
                        else {
                          if (bVar5 == false) {
                            onfree(local_2d8);
                            bVar6 = false;
                            break;
                          }
                          bVar6 = false;
                        }
                      }
                      bVar18 = 3 < uVar8;
                      uVar8 = uVar8 + 1;
                      iVar13 = iVar13 + -1;
                    } while (uVar8 != 5);
                    if (!bVar18) {
                      bVar19 = local_2c8._0_1_;
                      break;
                    }
                    uVar17 = uVar17 + 1;
                    bVar19 = (long)uVar17 < (long)local_2d0;
                  } while (uVar17 != local_290);
                }
                if ((bVar19 & 1) != 0) break;
                uVar8 = (uint)local_298 + 1;
                local_30c = (uint)CONCAT71((int7)(uVar22 >> 8),3 < (uint)local_298);
                uVar22 = (ulong)uVar8;
              } while (uVar8 != 5);
              memblock = local_2d8;
              if ((local_30c & 1) == 0) break;
              uVar17 = local_2a0 + 1;
              bVar3 = uVar17 < local_2b0;
            } while (uVar17 != local_2b0);
          }
          if (bVar3) goto LAB_005add2c;
          onfree(memblock);
          bVar3 = (bool)(bVar5 | bVar6);
          if ((local_2a8 != (ON_Torus *)0x0) && (bVar5 != false || bVar6 != false)) {
            pOVar16 = &local_1f8;
            if (local_338 < local_330) {
              pOVar16 = &local_288;
            }
            if (bVar6 == false) {
              pOVar16 = &local_1f8;
            }
            if (bVar5 == false) {
              pOVar16 = &local_288;
            }
            memcpy(local_2a8,pOVar16,0x90);
            bVar3 = true;
          }
        }
        else {
LAB_005add2c:
          bVar3 = false;
        }
LAB_005add2f:
        ON_Torus::~ON_Torus(&local_288);
        ON_Torus::~ON_Torus(&local_1f8);
      }
      ON_Plane::~ON_Plane(&local_160.plane);
      goto LAB_005add56;
    }
  }
  bVar3 = false;
LAB_005add56:
  ON_Plane::~ON_Plane(&local_c8.plane);
  return bVar3;
}

Assistant:

bool ON_Surface::IsTorus( ON_Torus* torus, double tolerance ) const
{
  if ( !ON_IsValid(tolerance) || tolerance <= 0.0 )
    tolerance = ON_ZERO_TOLERANCE;

  ON_Curve* crv = IsoCurve(0,Domain(1).Mid());
  if ( !crv )
    return false;

  ON_Arc arc0;
  int bIsArc0 = crv->IsArc(0,&arc0,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  delete crv;
  crv = 0;
  if ( !bIsArc0 )
    return false;

  crv = IsoCurve(1,Domain(0).Mid());
  if ( !crv )
    return false;
  ON_Arc arc1;
  int bIsArc1 = crv->IsArc(0,&arc1,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  delete crv;
  crv = 0;
  if ( !bIsArc1 )
    return false;

  double tol = 0.5*ON_SQRT_EPSILON*(arc0.radius+arc1.radius);

  ON_Torus tr0;
  tr0.plane = arc0.plane;
  double h = tr0.plane.plane_equation.ValueAt(arc1.plane.origin);
  tr0.plane.origin = tr0.plane.origin + h*tr0.plane.zaxis;
  tr0.plane.UpdateEquation();
  tr0.major_radius = tr0.plane.origin.DistanceTo(arc1.plane.origin);
  tr0.minor_radius = arc1.radius;

  ON_Torus tr1;
  tr1.plane = arc1.plane;
  h = tr1.plane.plane_equation.ValueAt(arc0.plane.origin);
  tr1.plane.origin = tr1.plane.origin + h*tr1.plane.zaxis;
  tr1.plane.UpdateEquation();
  tr1.major_radius = tr1.plane.origin.DistanceTo(arc0.plane.origin);
  tr1.minor_radius = arc0.radius;

  bool bTestTorus0 = tr0.IsValid()?true:false;
  bool bTestTorus1 = tr1.IsValid()?true:false;
  if ( !bTestTorus0 && !bTestTorus1 )
    return false;
  double tr0tol = 0.0;
  double tr1tol = 0.0;

  ON_3dPoint P, T;
  double a, d;
  for ( a = 0.0; a < 1.0; a += 0.25 )
  {
    P = arc0.PointAt(a*2.0*ON_PI);
    if ( bTestTorus0 )
    {
      T = tr0.ClosestPointTo(P);
      d = T.DistanceTo(P);
      if ( d > tol )
      {
        bTestTorus0 = false;
        if ( !bTestTorus1 )
          return false;
      }
      else if ( d > tr0tol )
        tr0tol = d;
    }
    if ( bTestTorus1 )
    {
      T = tr1.ClosestPointTo(P);
      d = T.DistanceTo(P);
      if ( d > tol )
      {
        bTestTorus1 = false;
        if ( !bTestTorus0 )
          return false;
      }
      else if ( d > tr1tol )
        tr1tol = d;
    }

    P = arc1.PointAt(a*2.0*ON_PI);
    if ( bTestTorus0 )
    {
      T = tr0.ClosestPointTo(P);
      d = T.DistanceTo(P);
      if ( d > tol )
      {
        bTestTorus0 = false;
        if ( !bTestTorus1 )
          return false;
      }
      else if ( d > tr0tol )
        tr0tol = d;
    }
    if ( bTestTorus1 )
    {
      T = tr1.ClosestPointTo(P);
      d = T.DistanceTo(P);
      if ( d > tol )
      {
        bTestTorus1 = false;
        if ( !bTestTorus0 )
          return false;
      }
      else if ( d > tr1tol )
        tr1tol = d;
    }
  }
  // If the arc's planes are perpendicular, then
  // both will be true unless we have a bug or
  // numerical issues.
  if (!bTestTorus0 && !bTestTorus1)
    return false;

  if ( tol < tolerance )
    tol = tolerance;

  double u, v;
  int sc0 = SpanCount(0);
  int sc1 = SpanCount(1);
  double* s = (double*)onmalloc( (sc0+sc1+2)*sizeof(s[0]) );
  double* t = s + (sc0+1);
  GetSpanVector(0,s);
  GetSpanVector(1,t);
  for ( int i = 0; i < sc0; i++ )
  {
    for ( int ii = i?1:0; ii <= 4; ii++ )
    {
      u = 0.25*((4-ii)*s[i] + ii*s[i+1]);
      for ( int j = 0; j < sc1; j++ )
      {
        for ( int jj = j?1:0; jj <= 4; jj++ )
        {
          v = 0.25*((4-jj)*t[j] + jj*t[j+1]);
          P = PointAt(u,v);
          if ( bTestTorus0 )
          {
            T = tr0.ClosestPointTo(P);
            d = T.DistanceTo(P);
            if ( d > tol )
            {
              bTestTorus0 = false;
              if ( !bTestTorus1 )
              {
                onfree(s);
                return false;
              }
            }
            else if ( d > tr0tol )
              tr0tol = d;
          }
          if ( bTestTorus1 )
          {
            T = tr1.ClosestPointTo(P);
            d = T.DistanceTo(P);
            if ( d > tol )
            {
              bTestTorus1 = false;
              if ( !bTestTorus0 )
              {
                onfree(s);
                return false;
              }
            }
            else if ( d > tr1tol )
              tr1tol = d;
          }
        }
      }
    }
  }
  onfree(s);

  bool rc = (bTestTorus0 || bTestTorus1);
  if ( rc && torus )
  {
    if (!bTestTorus0)
      *torus = tr1;
    else if (!bTestTorus1)
      *torus = tr0;
    else if (tr0tol <= tr1tol)
      *torus = tr0;
    else
      *torus = tr1;
  }

  return rc;
}